

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

void narrow_stripov_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  byte bVar1;
  jit_State *pjVar2;
  IRIns *pIVar3;
  NarrowIns *pNVar4;
  NarrowIns *pNVar5;
  IRRef *pIVar6;
  ptrdiff_t i;
  long lVar7;
  ulong uVar8;
  
  pjVar2 = nc->J;
  pIVar3 = (pjVar2->cur).ir;
  uVar8 = (ulong)ref;
  bVar1 = *(byte *)((long)pIVar3 + uVar8 * 8 + 5);
  if ((bVar1 - 0x35 < 2) || ((bVar1 == 0x37 && ((nc->mode & 0xf000) == 0x1000)))) {
    lVar7 = 0;
    do {
      if ((pjVar2->bpropcache[lVar7].key == (IRRef1)ref) &&
         ((pjVar2->bpropcache[lVar7].mode & 0xfff) == 0)) {
        ref = (IRRef)pjVar2->bpropcache[lVar7].val;
        goto LAB_0011dea8;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    if ((depth < 99) && (pNVar4 = nc->sp, pNVar4 < nc->maxsp)) {
      narrow_stripov_backprop(nc,(uint)pIVar3[uVar8].field_0.op1,depth + 1);
      if (nc->sp < nc->maxsp) {
        narrow_stripov_backprop(nc,(uint)*(ushort *)((long)pIVar3 + uVar8 * 8 + 2),depth + 1);
        pNVar5 = nc->sp;
        if (pNVar5 < nc->maxsp) {
          bVar1 = *(byte *)((long)pIVar3 + uVar8 * 8 + 5);
          nc->sp = pNVar5 + 1;
          *pNVar5 = (uint)bVar1 * 0x1000000 + ref + 0xf4130000;
          return;
        }
      }
      nc->sp = pNVar4;
    }
  }
LAB_0011dea8:
  pIVar6 = nc->sp;
  nc->sp = pIVar6 + 1;
  *pIVar6 = ref;
  return;
}

Assistant:

static void narrow_stripov_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  if (ir->o == IR_ADDOV || ir->o == IR_SUBOV ||
      (ir->o == IR_MULOV && (nc->mode & IRCONV_CONVMASK) == IRCONV_ANY)) {
    BPropEntry *bp = narrow_bpc_get(nc->J, ref, IRCONV_TOBIT);
    if (bp) {
      ref = bp->val;
    } else if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      narrow_stripov_backprop(nc, ir->op1, depth);
      if (nc->sp < nc->maxsp) {
	narrow_stripov_backprop(nc, ir->op2, depth);
	if (nc->sp < nc->maxsp) {
	  *nc->sp++ = NARROWINS(IRT(ir->o - IR_ADDOV + IR_ADD, IRT_INT), ref);
	  return;
	}
      }
      nc->sp = savesp;  /* Path too deep, need to backtrack. */
    }
  }
  *nc->sp++ = NARROWINS(NARROW_REF, ref);
}